

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtRuntime.cpp
# Opt level: O3

void __thiscall
JsrtRuntime::SetBeforeCollectCallback
          (JsrtRuntime *this,JsBeforeCollectCallback beforeCollectCallback,void *callbackContext)

{
  CollectCallBack *pCVar1;
  
  pCVar1 = this->collectCallback;
  if (beforeCollectCallback == (JsBeforeCollectCallback)0x0) {
    beforeCollectCallback = (JsBeforeCollectCallback)0x0;
    if (pCVar1 == (CollectCallBack *)0x0) {
      callbackContext = (void *)0x0;
      goto LAB_003b8a5e;
    }
    callbackContext = (void *)0x0;
    if (this->beforeSweepCallback != (JsBeforeSweepCallback)0x0) goto LAB_003b8a5e;
    ThreadContext::RemoveRecyclerCollectCallBack(this->threadContext,pCVar1);
    pCVar1 = (CollectCallBack *)0x0;
    beforeCollectCallback = (JsBeforeCollectCallback)0x0;
    callbackContext = (void *)0x0;
  }
  else {
    if (pCVar1 != (CollectCallBack *)0x0) goto LAB_003b8a5e;
    pCVar1 = ThreadContext::AddRecyclerCollectCallBack
                       (this->threadContext,RecyclerCollectCallbackStatic,this);
  }
  this->collectCallback = pCVar1;
LAB_003b8a5e:
  this->beforeCollectCallback = beforeCollectCallback;
  this->beforeCollectCallbackContext = callbackContext;
  return;
}

Assistant:

void JsrtRuntime::SetBeforeCollectCallback(JsBeforeCollectCallback beforeCollectCallback, void * callbackContext)
{
    if (beforeCollectCallback != nullptr)
    {
        if (this->collectCallback == nullptr)
        {
            this->collectCallback = this->threadContext->AddRecyclerCollectCallBack(RecyclerCollectCallbackStatic, this);
        }

        this->beforeCollectCallback = beforeCollectCallback;
        this->beforeCollectCallbackContext = callbackContext;
    }
    else
    {
        if (this->collectCallback != nullptr
#ifdef _CHAKRACOREBUILD
            && this->beforeSweepCallback == nullptr
#endif
            )
        {
            this->threadContext->RemoveRecyclerCollectCallBack(this->collectCallback);
            this->collectCallback = nullptr;
        }

        this->beforeCollectCallback = nullptr;
        this->beforeCollectCallbackContext = nullptr;
    }
}